

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrays.h
# Opt level: O0

void __thiscall glslang::TSmallArrayVector::changeFront(TSmallArrayVector *this,uint s)

{
  reference pvVar1;
  uint s_local;
  TSmallArrayVector *this_local;
  
  if (this->sizes == (TVector<glslang::TArraySize> *)0x0) {
    __assert_fail("sizes != nullptr",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                  ,0x7a,"void glslang::TSmallArrayVector::changeFront(unsigned int)");
  }
  pvVar1 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::front
                     (&this->sizes->
                       super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                     );
  if (pvVar1->node == (TIntermTyped *)0x0) {
    pvVar1 = std::vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>::front
                       (&this->sizes->
                         super_vector<glslang::TArraySize,_glslang::pool_allocator<glslang::TArraySize>_>
                       );
    pvVar1->size = s;
    return;
  }
  __assert_fail("sizes->front().node == nullptr",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/MachineIndependent/../Include/arrays.h"
                ,0x7c,"void glslang::TSmallArrayVector::changeFront(unsigned int)");
}

Assistant:

void changeFront(unsigned int s)
    {
        assert(sizes != nullptr);
        // this should only happen for implicitly sized arrays, not specialization constants
        assert(sizes->front().node == nullptr);
        sizes->front().size = s;
    }